

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O1

bool OpenMD::invertMatrix<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  int iVar1;
  long lVar2;
  ElemPoinerType pdVar3;
  long lVar4;
  
  if (size != 6) {
    return false;
  }
  iVar1 = LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>(A,tmp1Size,6,tmp2Size);
  if (iVar1 != 0) {
    lVar4 = 0;
    do {
      tmp2Size[4] = 0.0;
      tmp2Size[5] = 0.0;
      tmp2Size[2] = 0.0;
      tmp2Size[3] = 0.0;
      *tmp2Size = 0.0;
      tmp2Size[1] = 0.0;
      tmp2Size[lVar4] = 1.0;
      LUSolveLinearSystem<OpenMD::SquareMatrix<double,6>>(A,tmp1Size,tmp2Size,6);
      lVar2 = 0;
      pdVar3 = tmp2Size;
      do {
        *(double *)((long)AI + lVar2 * 8) = *pdVar3;
        pdVar3 = pdVar3 + 1;
        lVar2 = lVar2 + 6;
      } while (lVar2 != 0x24);
      lVar4 = lVar4 + 1;
      AI = (SquareMatrix<double,_6> *)((long)AI + 8);
    } while (lVar4 != 6);
  }
  return iVar1 != 0;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }